

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charls_jpegls_encoder.cpp
# Opt level: O1

void __thiscall
charls_jpegls_encoder::encode_scan
          (charls_jpegls_encoder *this,byte_span source,size_t stride,int32_t component_count)

{
  size_t sVar1;
  long lVar2;
  ulong uVar3;
  unique_ptr<charls::encoder_strategy,_std::default_delete<charls::encoder_strategy>_> codec;
  unique_ptr<charls::process_line,_std::default_delete<charls::process_line>_> process_line;
  frame_info frame_info;
  undefined1 local_61;
  undefined8 local_60;
  long *local_58;
  long *local_50;
  interleave_mode local_48;
  color_transformation local_44;
  undefined1 local_40;
  uint32_t local_38;
  uint32_t local_34;
  interleave_mode local_30;
  color_transformation local_2c;
  
  local_38 = (this->frame_info_).width;
  local_34 = (this->frame_info_).height;
  local_30 = (this->frame_info_).bits_per_sample;
  local_50 = (long *)(ulong)(uint)this->near_lossless_;
  local_48 = this->interleave_mode_;
  local_44 = this->color_transformation_;
  local_40 = 0;
  local_2c = component_count;
  charls::jls_codec_factory<charls::encoder_strategy>::create_codec
            ((jls_codec_factory<charls::encoder_strategy> *)&local_58,(frame_info *)&local_61,
             (coding_parameters *)&local_38,(jpegls_pc_parameters *)&local_50);
  (**(code **)(*local_58 + 0x10))(&local_50,local_58,source.data,source.size,stride);
  local_60 = local_50;
  local_50 = (long *)0x0;
  sVar1 = (this->writer_).byte_offset_;
  lVar2 = (**(code **)(*local_58 + 0x20))
                    (local_58,&local_60,(this->writer_).destination_.data + sVar1,
                     (this->writer_).destination_.size - sVar1);
  if (local_60 != (long *)0x0) {
    (**(code **)(*local_60 + 8))();
  }
  local_60 = (long *)0x0;
  uVar3 = lVar2 + (this->writer_).byte_offset_;
  if (uVar3 <= (this->writer_).destination_.size) {
    (this->writer_).byte_offset_ = uVar3;
    if (local_50 != (long *)0x0) {
      (**(code **)(*local_50 + 8))();
    }
    if (local_58 != (long *)0x0) {
      (**(code **)(*local_58 + 8))();
    }
    return;
  }
  __assert_fail("byte_offset_ + byte_count <= destination_.size",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/jpeg_stream_writer.h"
                ,0x6c,"void charls::jpeg_stream_writer::seek(const size_t)");
}

Assistant:

void encode_scan(const byte_span source, const size_t stride, const int32_t component_count)
    {
        const charls::frame_info frame_info{frame_info_.width, frame_info_.height, frame_info_.bits_per_sample,
                                            component_count};

        const auto codec{jls_codec_factory<encoder_strategy>().create_codec(
            frame_info, {near_lossless_, 0, interleave_mode_, color_transformation_, false}, preset_coding_parameters_)};
        std::unique_ptr<process_line> process_line(codec->create_process_line(source, stride));
        const size_t bytes_written{codec->encode_scan(std::move(process_line), writer_.remaining_destination())};

        // Synchronize the destination encapsulated in the writer (encode_scan works on a local copy)
        writer_.seek(bytes_written);
    }